

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int libssh2_session_method_pref(LIBSSH2_SESSION *session,int method_type,char *prefs)

{
  libssh2_endpoint_data *plVar1;
  int iVar2;
  size_t sVar3;
  LIBSSH2_KEX_METHOD **methodlist;
  char *pcVar4;
  LIBSSH2_COMMON_METHOD *pLVar5;
  char *pcVar6;
  size_t __n;
  char **ppcVar7;
  char *__s;
  int iStack_50;
  
  sVar3 = strlen(prefs);
  switch(method_type) {
  case 0:
    ppcVar7 = &session->kex_prefs;
    methodlist = libssh2_kex_methods;
    break;
  case 1:
    ppcVar7 = &session->hostkey_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_hostkey_methods();
    break;
  case 2:
    plVar1 = &session->local;
    goto LAB_0011ded8;
  case 3:
    plVar1 = &session->remote;
LAB_0011ded8:
    ppcVar7 = &plVar1->crypt_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)libssh2_crypt_methods();
    break;
  case 4:
    plVar1 = &session->local;
    goto LAB_0011defa;
  case 5:
    plVar1 = &session->remote;
LAB_0011defa:
    ppcVar7 = &plVar1->mac_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_mac_methods();
    break;
  case 6:
    plVar1 = &session->local;
    goto LAB_0011df08;
  case 7:
    plVar1 = &session->remote;
LAB_0011df08:
    ppcVar7 = &plVar1->comp_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)_libssh2_comp_methods(session);
    break;
  case 8:
    plVar1 = &session->local;
    goto LAB_0011df2a;
  case 9:
    plVar1 = &session->remote;
LAB_0011df2a:
    ppcVar7 = &plVar1->lang_prefs;
    methodlist = (LIBSSH2_KEX_METHOD **)0x0;
    break;
  default:
    pcVar6 = "Invalid parameter specified for method_type";
    iStack_50 = -0x22;
    goto LAB_0011e058;
  }
  __n = (size_t)((int)sVar3 + 1);
  pcVar6 = (char *)(*session->alloc)(__n,&session->abstract);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Error allocated space for method preferences";
    iStack_50 = -6;
  }
  else {
    memcpy(pcVar6,prefs,__n);
    __s = pcVar6;
    while (((__s != (char *)0x0 && (*__s != '\0')) &&
           ((LIBSSH2_HOSTKEY_METHOD **)methodlist != (LIBSSH2_HOSTKEY_METHOD **)0x0))) {
      pcVar4 = strchr(__s,0x2c);
      if (pcVar4 == (char *)0x0) {
        sVar3 = strlen(__s);
        iVar2 = (int)sVar3;
      }
      else {
        iVar2 = (int)pcVar4 - (int)__s;
      }
      pLVar5 = kex_get_method_by_name(__s,(long)iVar2,(LIBSSH2_COMMON_METHOD **)methodlist);
      if (pLVar5 == (LIBSSH2_COMMON_METHOD *)0x0) {
        if (pcVar4 == (char *)0x0) {
          __s[-(ulong)(pcVar6 < __s)] = '\0';
          goto LAB_0011dff6;
        }
        sVar3 = strlen(__s);
        memcpy(__s,pcVar4 + 1,sVar3 - (long)iVar2);
        __s = pcVar4 + 1;
      }
      else {
        __s = pcVar4 + 1;
        if (pcVar4 == (char *)0x0) {
LAB_0011dff6:
          __s = (char *)0x0;
        }
      }
    }
    if (*pcVar6 != '\0') {
      if (*ppcVar7 != (char *)0x0) {
        (*session->free)(*ppcVar7,&session->abstract);
      }
      *ppcVar7 = pcVar6;
      return 0;
    }
    (*session->free)(pcVar6,&session->abstract);
    pcVar6 = "The requested method(s) are not currently supported";
    iStack_50 = -0x21;
  }
LAB_0011e058:
  iVar2 = _libssh2_error(session,iStack_50,pcVar6);
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_session_method_pref(LIBSSH2_SESSION * session, int method_type,
                            const char *prefs)
{
    char **prefvar, *s, *newprefs;
    int prefs_len = strlen(prefs);
    const LIBSSH2_COMMON_METHOD **mlist;

    switch (method_type) {
    case LIBSSH2_METHOD_KEX:
        prefvar = &session->kex_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        prefvar = &session->hostkey_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        prefvar = &session->local.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        prefvar = &session->remote.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
        prefvar = &session->local.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_MAC_SC:
        prefvar = &session->remote.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
        prefvar = &session->local.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)
            _libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_COMP_SC:
        prefvar = &session->remote.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)
            _libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_LANG_CS:
        prefvar = &session->local.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_LANG_SC:
        prefvar = &session->remote.lang_prefs;
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "Invalid parameter specified for method_type");
    }

    s = newprefs = LIBSSH2_ALLOC(session, prefs_len + 1);
    if (!newprefs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Error allocated space for method preferences");
    }
    memcpy(s, prefs, prefs_len + 1);

    while (s && *s && mlist) {
        char *p = strchr(s, ',');
        int method_len = p ? (p - s) : (int) strlen(s);

        if (!kex_get_method_by_name(s, method_len, mlist)) {
            /* Strip out unsupported method */
            if (p) {
                memcpy(s, p + 1, strlen(s) - method_len);
            } else {
                if (s > newprefs) {
                    *(--s) = '\0';
                } else {
                    *s = '\0';
                }
            }
        }

        s = p ? (p + 1) : NULL;
    }

    if (strlen(newprefs) == 0) {
        LIBSSH2_FREE(session, newprefs);
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "The requested method(s) are not currently "
                              "supported");
    }

    if (*prefvar) {
        LIBSSH2_FREE(session, *prefvar);
    }
    *prefvar = newprefs;

    return 0;
}